

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_l2_norm(ggml_compute_params *params,ggml_tensor *dst)

{
  int *piVar1;
  uint *puVar2;
  float fVar3;
  float fVar4;
  ggml_tensor *pgVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  void *pvVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  byte bVar30;
  byte bVar31;
  char cVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  char *pcVar36;
  long lVar37;
  long lVar38;
  uint uVar39;
  undefined8 uVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  int np;
  uint uVar45;
  long lVar46;
  long lVar47;
  ushort uVar48;
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  float __x;
  undefined1 auVar56 [16];
  undefined1 extraout_var [60];
  long local_178;
  long local_170;
  long local_168;
  long local_150;
  long local_148;
  long local_140;
  long local_118;
  long local_110;
  
  pgVar5 = dst->src[0];
  if (pgVar5->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0xdf6,"fatal error");
  }
  cVar32 = ggml_are_same_shape(pgVar5);
  if (cVar32 == '\0') {
    pcVar36 = "ggml_are_same_shape(src0, dst)";
    uVar40 = 0xdc4;
  }
  else if (pgVar5->nb[0] == 4) {
    fVar3 = (float)dst->op_params[0];
    if (0.0 <= fVar3) {
      lVar6 = pgVar5->ne[3];
      if (0 < lVar6) {
        lVar7 = pgVar5->ne[2];
        lVar8 = pgVar5->ne[0];
        lVar9 = pgVar5->ne[1];
        sVar10 = pgVar5->nb[2];
        lVar43 = (long)params->nth;
        lVar41 = (long)params->ith;
        sVar11 = dst->nb[1];
        local_178 = 0;
        sVar12 = pgVar5->nb[1];
        uVar39 = (uint)lVar8;
        uVar45 = uVar39 & 0xffffffc0;
        lVar33 = (long)(int)uVar45;
        lVar38 = (long)(int)uVar39;
        if ((long)(int)uVar39 < lVar33 + 1) {
          lVar38 = lVar33 + 1;
        }
        local_140 = sVar12 * lVar41;
        auVar49 = vpbroadcastq_avx512f();
        sVar13 = dst->nb[2];
        local_148 = sVar11 * lVar41;
        sVar14 = pgVar5->nb[3];
        auVar49 = vmovdqu64_avx512f(auVar49);
        local_150 = local_148 + lVar33 * 4;
        sVar15 = dst->nb[3];
        do {
          if (0 < lVar7) {
            local_170 = 0;
            local_118 = local_148;
            local_110 = local_150;
            local_168 = local_140;
            do {
              if (lVar41 < lVar9) {
                lVar42 = local_110;
                lVar44 = local_118;
                lVar46 = local_168;
                lVar47 = lVar41;
                do {
                  if (lVar8 < 1) {
                    __x = 0.0;
                  }
                  else {
                    __x = 0.0;
                    lVar34 = 0;
                    do {
                      fVar4 = *(float *)((long)pgVar5->data + lVar34 * 4 + lVar46);
                      lVar34 = lVar34 + 1;
                      __x = __x + fVar4 * fVar4;
                    } while (lVar8 != lVar34);
                  }
                  pvVar16 = dst->data;
                  memcpy((void *)(lVar47 * sVar11 + local_170 * sVar13 + local_178 * sVar15 +
                                 (long)pvVar16),
                         (void *)((long)pgVar5->data +
                                 lVar47 * sVar12 + local_170 * sVar10 + local_178 * sVar14),
                         lVar8 * 4);
                  if (__x < 0.0) {
                    auVar50._0_4_ = sqrtf(__x);
                    auVar50._4_60_ = extraout_var;
                    auVar56 = auVar50._0_16_;
                  }
                  else {
                    auVar56 = vsqrtss_avx(ZEXT416((uint)__x),ZEXT416((uint)__x));
                  }
                  uVar40 = vcmpss_avx512f(auVar56,auVar56,3);
                  bVar29 = (bool)((byte)uVar40 & 1);
                  auVar50 = vmovdqu64_avx512f(auVar49);
                  auVar51 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                  auVar52 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                  auVar56 = vmaxss_avx(ZEXT416((uint)fVar3),auVar56);
                  auVar56._0_4_ =
                       1.0 / (float)((uint)bVar29 * (int)fVar3 + (uint)!bVar29 * auVar56._0_4_);
                  auVar56._4_12_ = SUB6012((undefined1  [60])0x0,0);
                  auVar53 = vbroadcastss_avx512f(auVar56);
                  if (0 < (int)uVar45) {
                    lVar34 = (long)pvVar16 + lVar44;
                    uVar35 = 0;
                    do {
                      lVar37 = 0;
                      do {
                        auVar54 = vmulps_avx512f(auVar53,*(undefined1 (*) [64])(lVar34 + lVar37));
                        *(undefined1 (*) [64])(lVar34 + lVar37) = auVar54;
                        lVar37 = lVar37 + 0x40;
                      } while (lVar37 != 0x100);
                      uVar35 = uVar35 + 0x40;
                      lVar34 = lVar34 + 0x100;
                    } while (uVar35 < uVar45);
                  }
                  if (uVar45 != uVar39) {
                    uVar35 = 0;
                    do {
                      auVar54 = vpbroadcastq_avx512f();
                      auVar55 = vporq_avx512f(auVar54,auVar51);
                      auVar54 = vporq_avx512f(auVar54,auVar52);
                      uVar40 = vpcmpuq_avx512f(auVar54,auVar50,2);
                      bVar30 = (byte)uVar40;
                      uVar40 = vpcmpuq_avx512f(auVar55,auVar50,2);
                      bVar31 = (byte)uVar40;
                      uVar48 = CONCAT11(bVar31,bVar30);
                      piVar1 = (int *)((long)pvVar16 + uVar35 * 4 + lVar42);
                      auVar54._4_4_ = (uint)((byte)(uVar48 >> 1) & 1) * piVar1[1];
                      auVar54._0_4_ = (uint)(bVar30 & 1) * *piVar1;
                      auVar54._8_4_ = (uint)((byte)(uVar48 >> 2) & 1) * piVar1[2];
                      auVar54._12_4_ = (uint)((byte)(uVar48 >> 3) & 1) * piVar1[3];
                      auVar54._16_4_ = (uint)((byte)(uVar48 >> 4) & 1) * piVar1[4];
                      auVar54._20_4_ = (uint)((byte)(uVar48 >> 5) & 1) * piVar1[5];
                      auVar54._24_4_ = (uint)((byte)(uVar48 >> 6) & 1) * piVar1[6];
                      auVar54._28_4_ = (uint)((byte)(uVar48 >> 7) & 1) * piVar1[7];
                      auVar54._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
                      auVar54._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
                      auVar54._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
                      auVar54._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
                      auVar54._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
                      auVar54._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
                      auVar54._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
                      auVar54._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
                      auVar54 = vmulps_avx512f(auVar53,auVar54);
                      puVar2 = (uint *)((long)pvVar16 + uVar35 * 4 + lVar42);
                      bVar29 = (bool)((byte)(uVar48 >> 1) & 1);
                      bVar17 = (bool)((byte)(uVar48 >> 2) & 1);
                      bVar18 = (bool)((byte)(uVar48 >> 3) & 1);
                      bVar19 = (bool)((byte)(uVar48 >> 4) & 1);
                      bVar20 = (bool)((byte)(uVar48 >> 5) & 1);
                      bVar21 = (bool)((byte)(uVar48 >> 6) & 1);
                      bVar22 = (bool)((byte)(uVar48 >> 7) & 1);
                      bVar23 = (bool)(bVar31 >> 1 & 1);
                      bVar24 = (bool)(bVar31 >> 2 & 1);
                      bVar25 = (bool)(bVar31 >> 3 & 1);
                      bVar26 = (bool)(bVar31 >> 4 & 1);
                      bVar27 = (bool)(bVar31 >> 5 & 1);
                      bVar28 = (bool)(bVar31 >> 6 & 1);
                      *puVar2 = (uint)(bVar30 & 1) * auVar54._0_4_ |
                                (uint)!(bool)(bVar30 & 1) * *puVar2;
                      puVar2[1] = (uint)bVar29 * auVar54._4_4_ | (uint)!bVar29 * puVar2[1];
                      puVar2[2] = (uint)bVar17 * auVar54._8_4_ | (uint)!bVar17 * puVar2[2];
                      puVar2[3] = (uint)bVar18 * auVar54._12_4_ | (uint)!bVar18 * puVar2[3];
                      puVar2[4] = (uint)bVar19 * auVar54._16_4_ | (uint)!bVar19 * puVar2[4];
                      puVar2[5] = (uint)bVar20 * auVar54._20_4_ | (uint)!bVar20 * puVar2[5];
                      puVar2[6] = (uint)bVar21 * auVar54._24_4_ | (uint)!bVar21 * puVar2[6];
                      puVar2[7] = (uint)bVar22 * auVar54._28_4_ | (uint)!bVar22 * puVar2[7];
                      puVar2[8] = (uint)(bVar31 & 1) * auVar54._32_4_ |
                                  (uint)!(bool)(bVar31 & 1) * puVar2[8];
                      puVar2[9] = (uint)bVar23 * auVar54._36_4_ | (uint)!bVar23 * puVar2[9];
                      puVar2[10] = (uint)bVar24 * auVar54._40_4_ | (uint)!bVar24 * puVar2[10];
                      puVar2[0xb] = (uint)bVar25 * auVar54._44_4_ | (uint)!bVar25 * puVar2[0xb];
                      puVar2[0xc] = (uint)bVar26 * auVar54._48_4_ | (uint)!bVar26 * puVar2[0xc];
                      puVar2[0xd] = (uint)bVar27 * auVar54._52_4_ | (uint)!bVar27 * puVar2[0xd];
                      puVar2[0xe] = (uint)bVar28 * auVar54._56_4_ | (uint)!bVar28 * puVar2[0xe];
                      puVar2[0xf] = (uint)(bVar31 >> 7) * auVar54._60_4_ |
                                    (uint)!(bool)(bVar31 >> 7) * puVar2[0xf];
                      uVar35 = uVar35 + 0x10;
                    } while (((lVar38 - lVar33) + 0xfU & 0xfffffffffffffff0) != uVar35);
                  }
                  lVar47 = lVar47 + lVar43;
                  lVar46 = lVar46 + sVar12 * lVar43;
                  lVar44 = lVar44 + sVar11 * lVar43;
                  lVar42 = lVar42 + sVar11 * lVar43;
                } while (lVar47 < lVar9);
              }
              local_168 = local_168 + sVar10;
              local_118 = local_118 + sVar13;
              local_110 = local_110 + sVar13;
              local_170 = local_170 + 1;
            } while (local_170 != lVar7);
          }
          local_140 = local_140 + sVar14;
          local_148 = local_148 + sVar15;
          local_150 = local_150 + sVar15;
          local_178 = local_178 + 1;
        } while (local_178 != lVar6);
      }
      return;
    }
    pcVar36 = "eps >= 0.0f";
    uVar40 = 0xdd0;
  }
  else {
    pcVar36 = "src0->nb[0] == sizeof(float)";
    uVar40 = 0xdc6;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar40,"GGML_ASSERT(%s) failed",pcVar36);
}

Assistant:

void ggml_compute_forward_l2_norm(
    const ggml_compute_params * params,
    ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_l2_norm_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}